

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

bool s2textformat::MakeIndex
               (string_view str,
               unique_ptr<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_> *index)

{
  MutableS2ShapeIndex *this;
  VType VVar1;
  undefined8 uVar2;
  ostream *poVar3;
  Vector3<double> *pVVar4;
  bool bVar5;
  bool bVar6;
  size_type sVar7;
  pointer *__ptr;
  char separator;
  undefined8 in_R8;
  string_view *point_str;
  pointer psVar8;
  pointer psVar9;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view piece;
  S2Point point;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<absl::string_view,_std::allocator<absl::string_view>_> strs;
  _Head_base<0UL,_S2Shape_*,_false> local_b8;
  _Head_base<0UL,_S2LaxPolylineShape_*,_false> local_b0;
  S2Point local_a8;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_90;
  S2LogMessage local_78;
  Vector3<double> *local_68;
  _Head_base<0UL,_S2Shape_*,_false> local_60;
  vector<absl::string_view,_std::allocator<absl::string_view>_> local_58;
  string_view local_40;
  
  local_40.length_ = str.length_;
  local_40.ptr_ = str.ptr_;
  absl::StrSplit<absl::string_view>(&local_58,&local_40,'#');
  if ((long)local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_start != 0x30) {
    sVar7 = 3;
    S2LogMessage::S2LogMessage
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0x13a,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.stream_,"Check failed: (3) == (strs.size()) ",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_78.stream_,"Must contain two # characters: ",0x1f);
    piece.length_ = sVar7;
    piece.ptr_ = (char *)local_40.length_;
    absl::operator<<((absl *)local_78.stream_,(ostream *)local_40.ptr_,piece);
    abort();
  }
  local_78._0_8_ = (ostream *)0x0;
  local_78.stream_ = (ostream *)0x0;
  local_68 = (Vector3<double> *)0x0;
  str_00.length_ = 0x7c;
  str_00.ptr_ = (char *)(local_58.
                         super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                         _M_impl.super__Vector_impl_data._M_start)->length_;
  SplitString(&local_90,
              (s2textformat *)
              (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
               _M_impl.super__Vector_impl_data._M_start)->ptr_,str_00,(char)in_R8);
  psVar9 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar8 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_a8.c_[0] = 0.0;
      local_a8.c_[1] = 0.0;
      local_a8.c_[2] = 0.0;
      bVar5 = MakePoint(*psVar8,&local_a8);
      if (!bVar5) goto LAB_0022fb7d;
      if (local_78.stream_ == (ostream *)local_68) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_78,
                   (iterator)local_78.stream_,&local_a8);
      }
      else {
        (&(local_78.stream_)->_vptr_basic_ostream)[2] = (_func_int **)local_a8.c_[2];
        (local_78.stream_)->_vptr_basic_ostream = (_func_int **)local_a8.c_[0];
        (&(local_78.stream_)->_vptr_basic_ostream)[1] = (_func_int **)local_a8.c_[1];
        local_78.stream_ = (ostream *)((long)local_78.stream_ + 0x18);
      }
      if (!bVar5) goto LAB_0022fb7d;
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar9);
  }
  if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_90.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  poVar3 = local_78.stream_;
  uVar2 = local_78._0_8_;
  if ((ostream *)local_78._0_8_ != local_78.stream_) {
    this = (index->_M_t).
           super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>.
           _M_t.
           super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>.
           super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl;
    local_60._M_head_impl = (S2Shape *)operator_new(0x28);
    pVVar4 = local_68;
    local_78._0_8_ = (ostream *)0x0;
    local_78.stream_ = (ostream *)0x0;
    local_68 = (Vector3<double> *)0x0;
    (local_60._M_head_impl)->id_ = -1;
    (local_60._M_head_impl)->_vptr_S2Shape = (_func_int **)&PTR__S2PointVectorShape_002c3368;
    local_60._M_head_impl[1]._vptr_S2Shape = (_func_int **)0x0;
    *(undefined8 *)&local_60._M_head_impl[1].id_ = 0;
    local_60._M_head_impl[1]._vptr_S2Shape = (_func_int **)uVar2;
    *(ostream **)&local_60._M_head_impl[1].id_ = poVar3;
    local_60._M_head_impl[2]._vptr_S2Shape = (_func_int **)pVVar4;
    MutableS2ShapeIndex::Add(this,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_60);
    if (local_60._M_head_impl != (S2Shape *)0x0) {
      (*(local_60._M_head_impl)->_vptr_S2Shape[1])();
    }
    local_60._M_head_impl = (S2Shape *)0x0;
  }
  str_01.length_ = 0x7c;
  str_01.ptr_ = (char *)local_58.
                        super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                        _M_impl.super__Vector_impl_data._M_start[1].length_;
  SplitString(&local_90,
              (s2textformat *)
              local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
              _M_impl.super__Vector_impl_data._M_start[1].ptr_,str_01,(char)in_R8);
  psVar9 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  separator = (char)in_R8;
  if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0022fabe:
    if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
        super__Vector_impl_data._M_start != (string_view *)0x0) {
      operator_delete(local_90.
                      super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    str_02.length_ = 0x7c;
    str_02.ptr_ = (char *)local_58.
                          super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                          _M_impl.super__Vector_impl_data._M_start[2].length_;
    SplitString(&local_90,
                (s2textformat *)
                local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                _M_impl.super__Vector_impl_data._M_start[2].ptr_,str_02,separator);
    bVar5 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (!bVar5) {
      psVar9 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_a8.c_[0] = 0.0;
        bVar6 = MakeLaxPolygon(*psVar9,(unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>
                                        *)&local_a8);
        VVar1 = local_a8.c_[0];
        if (!bVar6) {
          if ((S2LaxPolylineShape *)local_a8.c_[0] != (S2LaxPolylineShape *)0x0) {
            (*((S2Shape *)local_a8.c_[0])->_vptr_S2Shape[1])();
          }
          break;
        }
        local_a8.c_[0] = 0.0;
        local_b8._M_head_impl = (S2Shape *)VVar1;
        MutableS2ShapeIndex::Add
                  ((index->_M_t).
                   super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
                   .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
                   (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_b8);
        if (local_b8._M_head_impl != (S2Shape *)0x0) {
          (*(local_b8._M_head_impl)->_vptr_S2Shape[1])();
        }
        local_b8._M_head_impl = (S2Shape *)0x0;
        if (!bVar6) break;
        psVar9 = psVar9 + 1;
        bVar5 = psVar9 == local_90.
                          super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
      } while (!bVar5);
    }
    if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
        super__Vector_impl_data._M_start != (string_view *)0x0) {
      operator_delete(local_90.
                      super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    psVar8 = local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      local_a8.c_[0] = 0.0;
      bVar5 = MakeLaxPolyline(*psVar8,(unique_ptr<S2LaxPolylineShape,_std::default_delete<S2LaxPolylineShape>_>
                                       *)&local_a8);
      VVar1 = local_a8.c_[0];
      if (!bVar5) break;
      local_a8.c_[0] = 0.0;
      local_b0._M_head_impl = (S2LaxPolylineShape *)VVar1;
      MutableS2ShapeIndex::Add
                ((index->_M_t).
                 super___uniq_ptr_impl<MutableS2ShapeIndex,_std::default_delete<MutableS2ShapeIndex>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_MutableS2ShapeIndex_*,_std::default_delete<MutableS2ShapeIndex>_>
                 .super__Head_base<0UL,_MutableS2ShapeIndex_*,_false>._M_head_impl,
                 (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_b0);
      if (local_b0._M_head_impl != (S2LaxPolylineShape *)0x0) {
        (*((local_b0._M_head_impl)->super_S2Shape)._vptr_S2Shape[1])();
      }
      separator = (char)in_R8;
      local_b0._M_head_impl = (S2LaxPolylineShape *)0x0;
      if (!bVar5) goto LAB_0022fb7d;
      psVar8 = psVar8 + 1;
      if (psVar8 == psVar9) goto LAB_0022fabe;
    }
    if ((S2LaxPolylineShape *)local_a8.c_[0] != (S2LaxPolylineShape *)0x0) {
      (*((S2Shape *)local_a8.c_[0])->_vptr_S2Shape[1])();
    }
LAB_0022fb7d:
    if (local_90.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
        super__Vector_impl_data._M_start != (string_view *)0x0) {
      operator_delete(local_90.
                      super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    bVar5 = false;
  }
  if ((ostream *)local_78._0_8_ != (ostream *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
  if (local_58.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar5;
}

Assistant:

bool MakeIndex(string_view str, std::unique_ptr<MutableS2ShapeIndex>* index) {
  vector<string_view> strs = absl::StrSplit(str, '#');
  S2_DCHECK_EQ(3, strs.size()) << "Must contain two # characters: " << str;

  vector<S2Point> points;
  for (const auto& point_str : SplitString(strs[0], '|')) {
    S2Point point;
    if (!MakePoint(point_str, &point)) return false;
    points.push_back(point);
  }
  if (!points.empty()) {
    (*index)->Add(make_unique<S2PointVectorShape>(std::move(points)));
  }
  for (const auto& line_str : SplitString(strs[1], '|')) {
    std::unique_ptr<S2LaxPolylineShape> lax_polyline;
    if (!MakeLaxPolyline(line_str, &lax_polyline)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polyline.release()));
  }
  for (const auto& polygon_str : SplitString(strs[2], '|')) {
    std::unique_ptr<S2LaxPolygonShape> lax_polygon;
    if (!MakeLaxPolygon(polygon_str, &lax_polygon)) return false;
    (*index)->Add(unique_ptr<S2Shape>(lax_polygon.release()));
  }
  return true;
}